

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.hpp
# Opt level: O0

void __thiscall
ot::commissioner::Timer::Timer(Timer *this,event_base *aEventBase,Action *aAction,bool aIsSingle)

{
  short events;
  int iVar1;
  int flags;
  bool aIsSingle_local;
  Action *aAction_local;
  event_base *aEventBase_local;
  Timer *this_local;
  
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(&this->mFireTime);
  std::function<void_(ot::commissioner::Timer_&)>::function(&this->mAction,aAction);
  this->mIsSingle = aIsSingle;
  this->mEnabled = false;
  events = 0x10;
  if ((this->mIsSingle & 1U) != 0) {
    events = 0;
  }
  iVar1 = event_assign(&this->mTimerEvent,aEventBase,-1,events,HandleEvent,this);
  if (iVar1 != 0) {
    abort();
  }
  return;
}

Assistant:

Timer(struct event_base *aEventBase, Action aAction, bool aIsSingle = true)
        : mAction(aAction)
        , mIsSingle(aIsSingle)
        , mEnabled(false)
    {
        int flags = mIsSingle ? 0 : EV_PERSIST;

        VerifyOrDie(event_assign(&mTimerEvent, aEventBase, -1, flags, HandleEvent, this) == 0);
    }